

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

cf_void_t cf_memchk_init(void)

{
  cf_membzero(&g_memchk_ctx,0x40);
  g_memchk_ctx.inited = 1;
  g_memchk_ctx.alloc_info = cf_hashtbl_new(0x20,(cf_hashtbl_cb_f)0x0);
  cf_mutex_init(&g_memchk_ctx.mutex,(cf_mutex_attr_t *)0x0);
  return;
}

Assistant:

cf_void_t cf_memchk_init() {
#ifdef CF_MEMORY_DBG
    cf_membzero(&g_memchk_ctx, sizeof(g_memchk_ctx));
    g_memchk_ctx.inited = CF_TRUE;
    g_memchk_ctx.alloc_info = cf_hashtbl_new(32, CF_NULL_PTR);
    cf_mutex_init(&g_memchk_ctx.mutex, CF_NULL_PTR);
#endif
}